

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O0

int __thiscall deqp::gls::ShaderPerformanceCase::init(ShaderPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  TestLog *log_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  ShaderProgram *this_00;
  undefined4 extraout_var;
  int initialCallCount;
  ProgramSources local_e8;
  TestLog *local_18;
  TestLog *log;
  ShaderPerformanceCase *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  glu::makeVtxFragSources(&local_e8,&this->m_vertShaderSource,&this->m_fragShaderSource);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_e8);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_e8);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar1) {
    bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_initialCalibration);
    if (bVar1) {
      de::SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration>::operator->
                (&this->m_initialCalibration);
    }
    log_00 = local_18;
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    logRenderTargetInfo(log_00,(RenderTarget *)CONCAT44(extraout_var,iVar2));
    dVar3 = glu::ShaderProgram::getProgram(this->m_program);
    ShaderPerformanceMeasurer::init(&this->m_measurer,(EVP_PKEY_CTX *)(ulong)dVar3);
    ShaderPerformanceMeasurer::logParameters(&this->m_measurer,local_18);
    glu::operator<<(local_18,this->m_program);
    dVar3 = glu::ShaderProgram::getProgram(this->m_program);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,(ulong)dVar3);
    iVar2 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])();
  }
  else {
    glu::operator<<(local_18,this->m_program);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Compile failed")
    ;
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void ShaderPerformanceCase::init (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(m_vertShaderSource, m_fragShaderSource));

	if (m_program->isOk())
	{
		const int initialCallCount = m_initialCalibration ? m_initialCalibration->initialNumCalls : 1;
		logRenderTargetInfo(log, m_renderCtx.getRenderTarget());
		m_measurer.init(m_program->getProgram(), m_attributes, initialCallCount);
		m_measurer.logParameters(log);
		log << *m_program;
	}
	else
	{
		log << *m_program;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return; // Skip rest of init.
	}

	setupProgram(m_program->getProgram());
	setupRenderState();
}